

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O0

void QMakeVfs::deref(void)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  QHash<int,_QString> *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s_refCount = s_refCount + -1;
  if (s_refCount == 0) {
    QAtomicInt::QAtomicInt((QAtomicInt *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
    QAtomicInt::operator=
              ((QAtomicInt *)in_stack_fffffffffffffff0,
               (QAtomicInt *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    QHash<QString,_int>::clear((QHash<QString,_int> *)in_stack_fffffffffffffff0);
    QHash<int,_QString>::clear(in_stack_fffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeVfs::deref()
{
#ifdef PROEVALUATOR_THREAD_SAFE
    QMutexLocker locker(&s_mutex);
#endif
    if (!--s_refCount) {
        s_fileIdCounter = 0;
        s_fileIdMap.clear();
        s_idFileMap.clear();
    }
}